

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O0

void tcu::fillWithGrid1D(PixelBufferAccess *access,int cellSize,Vec4 *colorA,Vec4 *colorB)

{
  int iVar1;
  undefined4 local_2c;
  int mx;
  int x;
  Vec4 *colorB_local;
  Vec4 *colorA_local;
  int cellSize_local;
  PixelBufferAccess *access_local;
  
  local_2c = 0;
  while( true ) {
    iVar1 = ConstPixelBufferAccess::getWidth(&access->super_ConstPixelBufferAccess);
    if (iVar1 <= local_2c) break;
    if ((int)((long)((ulong)(uint)((int)((long)local_2c / (long)cellSize) >> 0x1f) << 0x20 |
                    (long)local_2c / (long)cellSize & 0xffffffffU) % 2) == 0) {
      PixelBufferAccess::setPixel(access,colorA,local_2c,0,0);
    }
    else {
      PixelBufferAccess::setPixel(access,colorB,local_2c,0,0);
    }
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

static void fillWithGrid1D (const PixelBufferAccess& access, int cellSize, const Vec4& colorA, const Vec4& colorB)
{
	for (int x = 0; x < access.getWidth(); x++)
	{
		int mx = (x / cellSize) % 2;

		if (mx)
			access.setPixel(colorB, x, 0);
		else
			access.setPixel(colorA, x, 0);
	}
}